

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit.cpp
# Opt level: O3

void __thiscall QLineEdit::focusOutEvent(QLineEdit *this,QFocusEvent *e)

{
  QLineEditPrivate *this_00;
  QWidgetLineControl *this_01;
  Data *pDVar1;
  bool bVar2;
  int iVar3;
  QWidget *pQVar4;
  
  this_00 = *(QLineEditPrivate **)&(this->super_QWidget).field_0x8;
  if (((this_00->control->m_passwordEchoTimer).m_id != Invalid) ||
     ((this_00->control->m_passwordEchoEditing & 1U) != 0)) {
    QLineEditPrivate::updatePasswordEchoEditing(this_00,false);
  }
  iVar3 = QFocusEvent::reason();
  if (iVar3 - 5U < 0xfffffffe) {
    QWidgetLineControl::deselect
              (*(QWidgetLineControl **)(*(long *)&(this->super_QWidget).field_0x8 + 600));
  }
  QLineEditPrivate::setCursorVisible(this_00,false);
  QWidgetLineControl::setBlinkingCursorEnabled((QWidgetLineControl *)this_00->control,false);
  if (iVar3 == 4) {
    pQVar4 = QApplication::activePopupWidget();
    if (pQVar4 != (QWidget *)0x0) {
      pQVar4 = QApplication::activePopupWidget();
      if (*(QLineEdit **)(*(long *)&pQVar4->field_0x8 + 0x10) == this) goto LAB_0041a751;
    }
  }
  if ((this_00->field_0x27c & 0x20) != 0) {
    this_01 = *(QWidgetLineControl **)(*(long *)&(this->super_QWidget).field_0x8 + 600);
    bVar2 = QWidgetLineControl::hasAcceptableInput(this_01,(QString *)(this_01 + 0x18));
    if (!bVar2) {
      bVar2 = QWidgetLineControl::fixup((QWidgetLineControl *)this_00->control);
      if (!bVar2) goto LAB_0041a751;
    }
    QMetaObject::activate((QObject *)this,&staticMetaObject,4,(void **)0x0);
    this_00->field_0x27c = this_00->field_0x27c & 0xdf;
  }
LAB_0041a751:
  pDVar1 = (this_00->control->m_completer).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this_00->control->m_completer).wp.value != (QObject *)0x0)) {
    QLineEditPrivate::disconnectCompleter(this_00);
  }
  QWidget::focusOutEvent(&this->super_QWidget,e);
  return;
}

Assistant:

void QLineEdit::focusOutEvent(QFocusEvent *e)
{
    Q_D(QLineEdit);
    if (d->control->passwordEchoEditing()) {
        // Reset the echomode back to PasswordEchoOnEdit when the widget loses
        // focus.
        d->updatePasswordEchoEditing(false);
    }

    Qt::FocusReason reason = e->reason();
    if (reason != Qt::ActiveWindowFocusReason &&
        reason != Qt::PopupFocusReason)
        deselect();

    d->setCursorVisible(false);
    d->control->setBlinkingCursorEnabled(false);
#ifdef QT_KEYPAD_NAVIGATION
    // editingFinished() is already emitted on LeaveEditFocus
    if (!QApplicationPrivate::keypadNavigationEnabled())
#endif
    if (reason != Qt::PopupFocusReason
        || !(QApplication::activePopupWidget() && QApplication::activePopupWidget()->parentWidget() == this)) {
            if (d->edited && (hasAcceptableInput() || d->control->fixup())) {
                emit editingFinished();
                d->edited = false;
            }
    }
#ifdef QT_KEYPAD_NAVIGATION
    d->control->setCancelText(QString());
#endif
#if QT_CONFIG(completer)
    if (d->control->completer())
        d->disconnectCompleter();
#endif
    QWidget::focusOutEvent(e);
}